

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall TcpServerImpl::SelectThread(TcpServerImpl *this)

{
  __atomic_base<unsigned_int> *this_00;
  bool bVar1;
  __int_type_conflict1 _Var2;
  reference piVar3;
  size_type sVar4;
  int local_1cc;
  duration<long,_std::ratio<1L,_1000L>_> local_1c8;
  type local_1c0;
  thread local_1b0 [3];
  int local_198 [2];
  int32_t fdClient;
  socklen_t addLen;
  sockaddr_storage addrCl;
  int n;
  int Sock_1;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  vector<int,_std::allocator<int>_> vSockets;
  int iRes;
  int Sock;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  fd_set *__arr;
  uint __i;
  int32_t maxFd;
  timeval timeout;
  fd_set readfd;
  atomic<unsigned_int> nNewConCbCount;
  TcpServerImpl *this_local;
  
  memset((void *)((long)readfd.fds_bits + 0x7c),0,4);
  do {
    do {
      if (((this->super_BaseSocketImpl).m_bStop & 1U) != 0) {
        while (_Var2 = std::__atomic_base::operator_cast_to_unsigned_int
                                 ((__atomic_base *)((long)readfd.fds_bits + 0x7c)), _Var2 != 0) {
          local_1cc = 1;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1000l>> *)&local_1c8,&local_1cc);
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_1c8);
        }
        Delete(this);
        return;
      }
      memset(&timeout.tv_usec,0,0x80);
      memset(&__i,0,0x10);
      __arr._4_4_ = 0;
      ___i = 2;
      timeout.tv_sec = 0;
      for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
        readfd.fds_bits[(ulong)(uint)__arr - 1] = 0;
      }
      __end2 = std::vector<int,_std::allocator<int>_>::begin(&this->m_vSock);
      _iRes = std::vector<int,_std::allocator<int>_>::end(&this->m_vSock);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)&iRes), bVar1) {
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end2);
        vSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = *piVar3;
        readfd.fds_bits
        [(long)(vSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ / 0x40) + -1] =
             1L << ((byte)((long)vSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_ % 0x40) & 0x3f) |
             readfd.fds_bits
             [(long)(vSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_ / 0x40) + -1];
        if (__arr._4_4_ <
            vSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_) {
          __arr._4_4_ = vSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2);
      }
      vSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           select(__arr._4_4_ + 1,(fd_set *)&timeout.tv_usec,(fd_set *)0x0,(fd_set *)0x0,
                  (timeval *)&__i);
    } while ((int)vSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage < 1);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range3);
    __end3 = std::vector<int,_std::allocator<int>_>::begin(&this->m_vSock);
    _n = std::vector<int,_std::allocator<int>_>::end(&this->m_vSock);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&n), bVar1) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end3);
      addrCl.__ss_align._4_4_ = *piVar3;
      if ((readfd.fds_bits[(long)(addrCl.__ss_align._4_4_ / 0x40) + -1] &
          1L << ((byte)((long)addrCl.__ss_align._4_4_ % 0x40) & 0x3f)) != 0) {
        for (addrCl.__ss_align._0_4_ = 0; (int)addrCl.__ss_align < 0x10;
            addrCl.__ss_align._0_4_ = (int)addrCl.__ss_align + 1) {
          local_198[1] = 0x80;
          local_198[0] = accept(addrCl.__ss_align._4_4_,(sockaddr *)&fdClient,
                                (socklen_t *)(local_198 + 1));
          if (local_198[0] == -1) break;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&__range3,local_198);
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end3);
    }
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)&__range3);
    if ((sVar4 != 0) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
      this_00 = (__atomic_base<unsigned_int> *)((long)readfd.fds_bits + 0x7c);
      std::__atomic_base<unsigned_int>::operator++(this_00,0);
      local_1c0.this = this;
      local_1c0.nNewConCbCount = (atomic<unsigned_int> *)this_00;
      std::thread::
      thread<TcpServerImpl::SelectThread()::__0,std::vector<int,std::allocator<int>>&,void>
                (local_1b0,&local_1c0,(vector<int,_std::allocator<int>_> *)&__range3);
      std::thread::detach();
      std::thread::~thread(local_1b0);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range3);
  } while( true );
}

Assistant:

void TcpServerImpl::SelectThread()
{
    atomic<uint32_t> nNewConCbCount(0);

    while (m_bStop == false)
    {
        fd_set readfd{};
        struct timeval timeout{};
        SOCKET maxFd = 0;

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);

        for (auto Sock : m_vSock)
        {
            FD_SET(Sock, &readfd);
            if (Sock > maxFd)
                maxFd = Sock;
        }

        const int iRes = ::select(static_cast<int>(maxFd + 1), &readfd, nullptr, nullptr, &timeout);
        if (iRes > 0)
        {
            vector<SOCKET> vSockets;

            for (auto Sock : m_vSock)
            {
                if (FD_ISSET(Sock, &readfd))
                {
                    for (int n = 0; n < 16; ++n)                // The ACCEPT_QUEUE is an optimization mechanism that allows the server to
                    {                                           // accept() up to this many connections before serving any of them.  The
                        struct sockaddr_storage addrCl;         // reason is that the timeout waiting for the accept() is much shorter
                        socklen_t addLen = sizeof(addrCl);      // than the timeout for the actual processing.

                        const SOCKET fdClient = ::accept(Sock, reinterpret_cast<struct sockaddr*>(&addrCl), &addLen);
                        if (fdClient == INVALID_SOCKET)
                            break;

                        vSockets.push_back(fdClient);
                    }
                }
            }

            if (vSockets.size() > 0 && m_bStop == false)
            {
                nNewConCbCount++;

                thread([this, &nNewConCbCount](const vector<SOCKET> vNewSockets)
                {
                    vector<TcpSocket*> vNewConnections;
                    for (const SOCKET sock : vNewSockets)
                    {
                        TcpSocket* pClient = MakeClientConnection(sock);
                        if (pClient == nullptr)
                            continue;
                        if (pClient->GetErrorNo() != 0)
                        {
                            if (m_fErrorParam)
                                m_fErrorParam(pClient, m_pvUserData);  // Must call Close() in the error callback
                            else if (m_fError)
                                m_fError(pClient);  // Must call Close() in the error callback
                            else
                                pClient->Close();
                            continue;
                        }
                        vNewConnections.push_back(pClient);
                    }
                    if (m_fNewConnectionParam != nullptr && m_bStop != true)
                        m_fNewConnectionParam(vNewConnections, m_pvUserData);
                    else if (m_fNewConnection != nullptr && m_bStop != true)
                        m_fNewConnection(vNewConnections);
                    else
                    {
                        for (auto pClient : vNewConnections)
                            pClient->Close();
                    }
                    nNewConCbCount--;
                }, vSockets).detach();
            }
        }
    }

    while (nNewConCbCount != 0)
        this_thread::sleep_for(chrono::milliseconds(1));

    Delete();
}